

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O1

bool __thiscall
TorControlConnection::Command(TorControlConnection *this,string *cmd,ReplyHandlerCB *reply_handler)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->b_conn == (bufferevent *)0x0) {
    bVar3 = false;
  }
  else {
    lVar2 = bufferevent_get_output();
    bVar3 = lVar2 != 0;
    if (bVar3) {
      evbuffer_add(lVar2,(cmd->_M_dataplus)._M_p,cmd->_M_string_length);
      evbuffer_add(lVar2,"\r\n",2);
      std::
      deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
      ::push_back(&this->reply_handlers,reply_handler);
      bVar3 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool TorControlConnection::Command(const std::string &cmd, const ReplyHandlerCB& reply_handler)
{
    if (!b_conn)
        return false;
    struct evbuffer *buf = bufferevent_get_output(b_conn);
    if (!buf)
        return false;
    evbuffer_add(buf, cmd.data(), cmd.size());
    evbuffer_add(buf, "\r\n", 2);
    reply_handlers.push_back(reply_handler);
    return true;
}